

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_kiss.c
# Opt level: O0

int csp_kiss_add_interface(csp_iface_t *iface)

{
  long *plVar1;
  csp_iface_t *in_RDI;
  csp_kiss_interface_data_t *ifdata;
  int local_4;
  
  if (((in_RDI == (csp_iface_t *)0x0) || (in_RDI->name == (char *)0x0)) ||
     (in_RDI->interface_data == (void *)0x0)) {
    local_4 = -2;
  }
  else {
    plVar1 = (long *)in_RDI->interface_data;
    if (*plVar1 == 0) {
      local_4 = -2;
    }
    else {
      *(undefined4 *)((long)plVar1 + 0xc) = 0;
      *(undefined4 *)(plVar1 + 1) = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      plVar1[3] = 0;
      in_RDI->nexthop = csp_kiss_tx;
      csp_iflist_add(in_RDI);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int csp_kiss_add_interface(csp_iface_t * iface) {

	if ((iface == NULL) || (iface->name == NULL) || (iface->interface_data == NULL)) {
		return CSP_ERR_INVAL;
	}

	csp_kiss_interface_data_t * ifdata = iface->interface_data;
	if (ifdata->tx_func == NULL) {
		return CSP_ERR_INVAL;
	}

	ifdata->rx_length = 0;
	ifdata->rx_mode = KISS_MODE_NOT_STARTED;
	ifdata->rx_first = false;
	ifdata->rx_packet = NULL;

	iface->nexthop = csp_kiss_tx;

	csp_iflist_add(iface);

	return CSP_ERR_NONE;
}